

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

Own<kj::_::ImmediatePromiseNode<kj::Maybe<kj::HttpHeaders::Request>_>_> __thiscall
kj::
heap<kj::_::ImmediatePromiseNode<kj::Maybe<kj::HttpHeaders::Request>>,kj::Maybe<kj::HttpHeaders::Request>>
          (kj *this,Maybe<kj::HttpHeaders::Request> *params)

{
  ImmediatePromiseNode<kj::Maybe<kj::HttpHeaders::Request>_> *pIVar1;
  ImmediatePromiseNode<kj::Maybe<kj::HttpHeaders::Request>_> *extraout_RDX;
  ImmediatePromiseNode<kj::Maybe<kj::HttpHeaders::Request>_> *extraout_RDX_00;
  Own<kj::_::ImmediatePromiseNode<kj::Maybe<kj::HttpHeaders::Request>_>_> OVar2;
  ExceptionOr<kj::Maybe<kj::HttpHeaders::Request>_> local_1a0;
  
  pIVar1 = (ImmediatePromiseNode<kj::Maybe<kj::HttpHeaders::Request>_> *)operator_new(400);
  local_1a0.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_1a0.value.ptr.isSet = true;
  local_1a0.value.ptr.field_1.value.ptr.isSet = (params->ptr).isSet;
  if (local_1a0.value.ptr.field_1.value.ptr.isSet == true) {
    local_1a0.value.ptr.field_1._24_8_ = (params->ptr).field_1.value.url.content.size_;
    local_1a0.value.ptr.field_1._8_8_ = *(undefined8 *)&(params->ptr).field_1;
    local_1a0.value.ptr.field_1._16_8_ = (params->ptr).field_1.value.url.content.ptr;
  }
  _::ImmediatePromiseNode<kj::Maybe<kj::HttpHeaders::Request>_>::ImmediatePromiseNode
            (pIVar1,&local_1a0);
  *(undefined8 **)this =
       &_::HeapDisposer<kj::_::ImmediatePromiseNode<kj::Maybe<kj::HttpHeaders::Request>>>::instance;
  *(ImmediatePromiseNode<kj::Maybe<kj::HttpHeaders::Request>_> **)(this + 8) = pIVar1;
  pIVar1 = extraout_RDX;
  if (local_1a0.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_1a0.super_ExceptionOrValue.exception.ptr.field_1.value);
    pIVar1 = extraout_RDX_00;
  }
  OVar2.ptr = pIVar1;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}